

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int SafeDecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s,int position)

{
  BrotliBitReader *br;
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  HuffmanCode **ppHVar6;
  int iVar7;
  ulong uVar8;
  size_t sVar9;
  uint32_t uVar10;
  HuffmanCode *pHVar11;
  HuffmanCode *pHVar12;
  uint uVar13;
  uint32_t uVar14;
  uint64_t uVar15;
  size_t sVar16;
  uint uVar17;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  uVar17 = s->num_block_types[0];
  if (uVar17 < 2) {
LAB_00143088:
    iVar7 = 0;
  }
  else {
    pHVar11 = s->block_type_trees;
    pHVar12 = s->block_len_trees;
    br = &s->br;
    uVar3 = (s->br).val_;
    uVar2 = (s->br).bit_pos_;
    pbVar4 = (s->br).next_in;
    sVar9 = (s->br).avail_in;
    uVar13 = uVar2 - 0x32;
    uVar8 = uVar3;
    uVar10 = uVar2;
    pbVar5 = pbVar4;
    sVar16 = sVar9;
    while (uVar13 < 0xf) {
      sVar16 = sVar16 - 1;
      if (sVar16 == 0xffffffffffffffff) {
        local_38 = uVar17;
        iVar7 = SafeDecodeSymbol(pHVar11,br,&local_3c);
        uVar17 = local_38;
        if (iVar7 != 0) goto LAB_00142e77;
        goto LAB_00143088;
      }
      (s->br).val_ = uVar8 >> 8;
      uVar8 = uVar8 >> 8 | (ulong)*pbVar5 << 0x38;
      (s->br).val_ = uVar8;
      (s->br).bit_pos_ = uVar10 - 8;
      (s->br).avail_in = sVar16;
      (s->br).next_in = pbVar5 + 1;
      uVar13 = uVar10 - 0x3a;
      uVar10 = uVar10 - 8;
      pbVar5 = pbVar5 + 1;
    }
    uVar8 = uVar8 >> ((byte)uVar10 & 0x3f);
    pHVar11 = pHVar11 + (uVar8 & 0xff);
    uVar13 = (uint)pHVar11->bits;
    if (8 < uVar13) {
      uVar10 = uVar10 + 8;
      pHVar11 = pHVar11 + (((uint)(uVar8 >> 8) & 0xffffff & kBitMask[pHVar11->bits - 8] & 0x7f) +
                          (uint)pHVar11->value);
      uVar13 = (uint)pHVar11->bits;
    }
    (s->br).bit_pos_ = uVar13 + uVar10;
    local_3c = (uint)pHVar11->value;
LAB_00142e77:
    if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
      uVar10 = (s->br).bit_pos_;
      if (uVar10 - 0x32 < 0xf) {
        sVar16 = (s->br).avail_in;
        uVar14 = uVar10;
        do {
          sVar16 = sVar16 - 1;
          if (sVar16 == 0xffffffffffffffff) {
            iVar7 = SafeDecodeSymbol(pHVar12,br,&local_34);
            if (iVar7 == 0) goto LAB_0014306f;
            goto LAB_00142f8d;
          }
          uVar8 = (s->br).val_;
          pbVar5 = (s->br).next_in;
          (s->br).val_ = uVar8 >> 8;
          uVar8 = (ulong)*pbVar5 << 0x38 | uVar8 >> 8;
          (s->br).val_ = uVar8;
          uVar10 = uVar14 - 8;
          (s->br).bit_pos_ = uVar10;
          (s->br).avail_in = sVar16;
          (s->br).next_in = pbVar5 + 1;
          uVar13 = uVar14 - 0x3a;
          uVar14 = uVar10;
        } while (uVar13 < 0xf);
      }
      else {
        uVar8 = br->val_;
      }
      uVar8 = uVar8 >> ((byte)uVar10 & 0x3f);
      pHVar12 = pHVar12 + (uVar8 & 0xff);
      uVar13 = (uint)pHVar12->bits;
      if (8 < uVar13) {
        uVar10 = uVar10 + 8;
        pHVar12 = pHVar12 + (((uint)(uVar8 >> 8) & 0xffffff & kBitMask[pHVar12->bits - 8] & 0x7f) +
                            (uint)pHVar12->value);
        uVar13 = (uint)pHVar12->bits;
      }
      (s->br).bit_pos_ = uVar13 + uVar10;
      local_34 = (uint)pHVar12->value;
    }
    else {
      local_34 = s->block_length_index;
    }
LAB_00142f8d:
    bVar1 = kBlockLengthPrefixCode[local_34].nbits;
    uVar10 = (s->br).bit_pos_;
    uVar13 = 0x40 - uVar10;
    if (uVar13 < bVar1) {
      sVar16 = (s->br).avail_in;
      do {
        sVar16 = sVar16 - 1;
        if (sVar16 == 0xffffffffffffffff) {
          s->block_length_index = local_34;
LAB_0014306f:
          s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
          (s->br).val_ = uVar3;
          (s->br).bit_pos_ = uVar2;
          (s->br).next_in = pbVar4;
          (s->br).avail_in = sVar9;
          goto LAB_00143088;
        }
        uVar8 = (s->br).val_;
        pbVar5 = (s->br).next_in;
        (s->br).val_ = uVar8 >> 8;
        uVar15 = (ulong)*pbVar5 << 0x38 | uVar8 >> 8;
        (s->br).val_ = uVar15;
        uVar10 = uVar10 - 8;
        (s->br).bit_pos_ = uVar10;
        (s->br).avail_in = sVar16;
        (s->br).next_in = pbVar5 + 1;
        uVar13 = uVar13 + 8;
      } while (uVar13 < bVar1);
    }
    else {
      uVar15 = br->val_;
    }
    uVar13 = kBitMask[(uint)bVar1];
    (s->br).bit_pos_ = uVar10 + bVar1;
    s->block_length[0] =
         (uint)kBlockLengthPrefixCode[local_34].offset +
         ((uint)(uVar15 >> ((byte)uVar10 & 0x3f)) & uVar13);
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    if (local_3c == 0) {
      local_3c = s->block_type_rb[0];
    }
    else if (local_3c == 1) {
      local_3c = s->block_type_rb[1] + 1;
    }
    else {
      local_3c = local_3c - 2;
    }
    uVar13 = 0;
    if (uVar17 <= local_3c) {
      uVar13 = uVar17;
    }
    local_3c = local_3c - uVar13;
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = local_3c;
    if ((s->field_0x338 & 0x40) != 0) {
      if (s->saved_position_literals_begin == 0) {
        sVar9 = (s->literals_block_splits).num_blocks;
      }
      else {
        sVar9 = (s->literals_block_splits).num_blocks;
        (s->literals_block_splits).positions_end[sVar9] = position;
        sVar9 = sVar9 + 1;
        (s->literals_block_splits).num_blocks = sVar9;
      }
      (s->literals_block_splits).positions_begin[sVar9] = position;
      (s->literals_block_splits).types[sVar9] =
           (char)(int)(s->literals_block_splits).num_types_prev_metablocks +
           (char)s->block_type_rb[1];
      uVar3 = (s->literals_block_splits).num_types;
      uVar8 = (ulong)(s->literals_block_splits).types[(s->literals_block_splits).num_blocks] + 1;
      if (uVar8 < uVar3) {
        uVar8 = uVar3;
      }
      (s->literals_block_splits).num_types = uVar8;
      local_3c = s->block_type_rb[1];
    }
    ppHVar6 = (s->literal_hgroup).htrees;
    s->context_map_slice = s->context_map + (local_3c << 6);
    s->trivial_literal_context =
         (uint)((s->trivial_literal_contexts[local_3c >> 5] >> (local_3c & 0x1f) & 1) != 0);
    s->literal_htree = ppHVar6[s->context_map[local_3c << 6]];
    s->context_lookup = "" + ((s->context_modes[local_3c] & 3) << 9);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}